

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

int Sbd_ManCutCollect_rec
              (Gia_Man_t *p,Vec_Int_t *vMirrors,int iObj,int LevStop,Vec_Int_t *vLutLevs,
              Vec_Int_t *vCut)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  
  iVar1 = Vec_IntEntry(vMirrors,iObj);
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vMirrors,iObj);
    iObj = Abc_Lit2Var(iVar1);
  }
  bVar5 = true;
  if (iObj != 0) {
    iVar1 = Gia_ObjIsTravIdCurrentId(p,iObj);
    if (iVar1 == 0) {
      Gia_ObjSetTravIdCurrentId(p,iObj);
      pGVar4 = Gia_ManObj(p,iObj);
      if ((~*(uint *)pGVar4 & 0x9fffffff) != 0) {
        iVar1 = Vec_IntEntry(vLutLevs,iObj);
        if (LevStop < iVar1) {
          uVar2 = (uint)*(undefined8 *)pGVar4;
          if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                          ,0xf9,
                          "int Sbd_ManCutCollect_rec(Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar1 = Sbd_ManCutCollect_rec
                            (p,vMirrors,iObj - (uVar2 & 0x1fffffff),LevStop,vLutLevs,vCut);
          iVar3 = Sbd_ManCutCollect_rec
                            (p,vMirrors,iObj - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff),LevStop,
                             vLutLevs,vCut);
          bVar5 = iVar3 != 0 && iVar1 != 0;
          goto LAB_004602a6;
        }
      }
      Vec_IntPush(vCut,iObj);
      iVar1 = Vec_IntEntry(vLutLevs,iObj);
      bVar5 = iVar1 <= LevStop;
    }
  }
LAB_004602a6:
  return (int)bVar5;
}

Assistant:

int Sbd_ManCutCollect_rec( Gia_Man_t * p, Vec_Int_t * vMirrors, int iObj, int LevStop, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    Gia_Obj_t * pObj; 
    int Ret0, Ret1;
    if ( Vec_IntEntry(vMirrors, iObj) >= 0 )
        iObj = Abc_Lit2Var(Vec_IntEntry(vMirrors, iObj));
    if ( !iObj || Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 1;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) || Vec_IntEntry(vLutLevs, iObj) <= LevStop )
    {
        Vec_IntPush( vCut, iObj );
        return Vec_IntEntry(vLutLevs, iObj) <= LevStop;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Ret0 = Sbd_ManCutCollect_rec( p, vMirrors, Gia_ObjFaninId0(pObj, iObj), LevStop, vLutLevs, vCut );
    Ret1 = Sbd_ManCutCollect_rec( p, vMirrors, Gia_ObjFaninId1(pObj, iObj), LevStop, vLutLevs, vCut );
    return Ret0 && Ret1;
}